

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

UBool __thiscall icu_63::PatternMap::equals(PatternMap *this,PatternMap *other)

{
  PtnSkeleton *this_00;
  PtnSkeleton *other_00;
  UBool UVar1;
  PtnElem *pPVar2;
  PtnElem *pPVar3;
  int32_t bootIndex;
  ulong uVar4;
  
  if (this == other) {
    return '\x01';
  }
  for (uVar4 = 0; uVar4 != 0x34; uVar4 = uVar4 + 1) {
    pPVar2 = this->boot[uVar4];
    pPVar3 = other->boot[uVar4];
    if (pPVar2 != pPVar3) {
      if ((pPVar2 == (PtnElem *)0x0) || (pPVar3 == (PtnElem *)0x0)) break;
      for (; (pPVar2 != pPVar3 && (pPVar3 != (PtnElem *)0x0 || pPVar2 != (PtnElem *)0x0));
          pPVar3 = (pPVar3->next).super_LocalPointerBase<icu_63::PtnElem>.ptr) {
        if ((pPVar3 == (PtnElem *)0x0) || (pPVar2 == (PtnElem *)0x0)) goto LAB_002d3976;
        UVar1 = icu_63::UnicodeString::operator!=(&pPVar2->basePattern,&pPVar3->basePattern);
        if (UVar1 != '\0') goto LAB_002d3976;
        UVar1 = icu_63::UnicodeString::operator!=(&pPVar2->pattern,&pPVar3->pattern);
        if (UVar1 != '\0') goto LAB_002d3976;
        this_00 = (pPVar2->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>.ptr;
        other_00 = (pPVar3->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>.ptr;
        if (this_00 != other_00) {
          UVar1 = PtnSkeleton::equals(this_00,other_00);
          if (UVar1 == '\0') goto LAB_002d3976;
        }
        pPVar2 = (pPVar2->next).super_LocalPointerBase<icu_63::PtnElem>.ptr;
      }
    }
  }
LAB_002d3976:
  return 0x33 < uVar4;
}

Assistant:

UBool
PatternMap::equals(const PatternMap& other) const {
    if ( this==&other ) {
        return TRUE;
    }
    for (int32_t bootIndex = 0; bootIndex < MAX_PATTERN_ENTRIES; ++bootIndex) {
        if (boot[bootIndex] == other.boot[bootIndex]) {
            continue;
        }
        if ((boot[bootIndex] == nullptr) || (other.boot[bootIndex] == nullptr)) {
            return FALSE;
        }
        PtnElem *otherElem = other.boot[bootIndex];
        PtnElem *myElem = boot[bootIndex];
        while ((otherElem != nullptr) || (myElem != nullptr)) {
            if ( myElem == otherElem ) {
                break;
            }
            if ((otherElem == nullptr) || (myElem == nullptr)) {
                return FALSE;
            }
            if ( (myElem->basePattern != otherElem->basePattern) ||
                 (myElem->pattern != otherElem->pattern) ) {
                return FALSE;
            }
            if ((myElem->skeleton.getAlias() != otherElem->skeleton.getAlias()) &&
                !myElem->skeleton->equals(*(otherElem->skeleton))) {
                return FALSE;
            }
            myElem = myElem->next.getAlias();
            otherElem = otherElem->next.getAlias();
        }
    }
    return TRUE;
}